

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_is_mirrored(Integer g_a)

{
  Integer p_handle;
  Integer handle;
  Integer ret;
  Integer g_a_local;
  
  ret = 0;
  if (-1 < (long)GA[g_a + 1000].p_handle) {
    ret = (Integer)(PGRP_LIST[GA[g_a + 1000].p_handle].mirrored != 0);
  }
  return ret;
}

Assistant:

logical pnga_is_mirrored(Integer g_a)
{
  Integer ret = FALSE;
  Integer handle = GA_OFFSET + g_a;
  Integer p_handle = (Integer)GA[handle].p_handle;
  if (p_handle >= 0) {
     if (PGRP_LIST[p_handle].mirrored) ret = TRUE;
  }
  return ret;
}